

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.cxx
# Opt level: O0

bool __thiscall
cmGetSourceFilePropertyCommand::InitialPass
          (cmGetSourceFilePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  cmSourceFile *this_01;
  string *name;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *value;
  ulong uVar4;
  char *local_a0;
  char *prop;
  cmSourceFile *local_78;
  cmSourceFile *sf;
  string *file;
  string *var;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmGetSourceFilePropertyCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 != 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    return false;
  }
  file = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local,0);
  sf = (cmSourceFile *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local,1);
  local_78 = cmMakefile::GetSource((this->super_cmCommand).Makefile,(string *)sf,Ambiguous);
  if (local_78 == (cmSourceFile *)0x0) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar1 = std::operator==(pvVar3,"LOCATION");
    if (bVar1) {
      local_78 = cmMakefile::CreateSource
                           ((this->super_cmCommand).Makefile,(string *)sf,false,Ambiguous);
    }
  }
  if (local_78 != (cmSourceFile *)0x0) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar1 = std::operator==(pvVar3,"LANGUAGE");
    name = file;
    if (bVar1) {
      this_00 = (this->super_cmCommand).Makefile;
      cmSourceFile::GetLanguage_abi_cxx11_((string *)&prop,local_78);
      value = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,name,value);
      std::__cxx11::string::~string((string *)&prop);
      return true;
    }
    local_a0 = (char *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local,2);
    uVar4 = std::__cxx11::string::empty();
    this_01 = local_78;
    if ((uVar4 & 1) == 0) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,2);
      local_a0 = cmSourceFile::GetPropertyForUser(this_01,pvVar3);
    }
    if (local_a0 != (char *)0x0) {
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,file,local_a0);
      return true;
    }
  }
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,file,"NOTFOUND");
  return true;
}

Assistant:

bool cmGetSourceFilePropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string const& var = args[0];
  std::string const& file = args[1];
  cmSourceFile* sf = this->Makefile->GetSource(file);

  // for the location we must create a source file first
  if (!sf && args[2] == "LOCATION") {
    sf = this->Makefile->CreateSource(file);
  }
  if (sf) {
    if (args[2] == "LANGUAGE") {
      this->Makefile->AddDefinition(var, sf->GetLanguage().c_str());
      return true;
    }
    const char* prop = nullptr;
    if (!args[2].empty()) {
      prop = sf->GetPropertyForUser(args[2]);
    }
    if (prop) {
      this->Makefile->AddDefinition(var, prop);
      return true;
    }
  }

  this->Makefile->AddDefinition(var, "NOTFOUND");
  return true;
}